

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O3

bool __thiscall google::protobuf::compiler::ZipWriter::WriteDirectory(ZipWriter *this)

{
  uint32 value;
  uint32 value_00;
  pointer pFVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  uint8 p [2];
  CodedOutputStream output;
  undefined2 local_76;
  uint32 local_74;
  ulong local_70;
  CodedOutputStream local_68;
  undefined8 local_48;
  long local_40;
  ZipWriter *local_38;
  
  uVar4 = ((long)(this->files_).
                 super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->files_).
                 super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  iVar3 = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  local_48 = CONCAT44(extraout_var,iVar3);
  local_38 = this;
  io::CodedOutputStream::CodedOutputStream(&local_68,this->raw_output_);
  local_70 = uVar4;
  if ((short)uVar4 != 0) {
    local_40 = (uVar4 & 0xffff) * 0x30;
    lVar5 = 0;
    do {
      pFVar1 = (local_38->files_).
               super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = *(undefined8 *)((long)&(pFVar1->name)._M_string_length + lVar5);
      value = *(uint32 *)((long)&pFVar1->crc32 + lVar5);
      value_00 = *(uint32 *)((long)&pFVar1->size + lVar5);
      local_74 = *(uint32 *)((long)&pFVar1->offset + lVar5);
      io::CodedOutputStream::WriteLittleEndian32(&local_68,0x2014b50);
      local_76 = 10;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 10;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      io::CodedOutputStream::WriteLittleEndian32(&local_68,value);
      io::CodedOutputStream::WriteLittleEndian32(&local_68,value_00);
      io::CodedOutputStream::WriteLittleEndian32(&local_68,value_00);
      local_76 = (undefined2)uVar2;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      local_76 = 0;
      io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
      io::CodedOutputStream::WriteLittleEndian32(&local_68,0);
      io::CodedOutputStream::WriteLittleEndian32(&local_68,local_74);
      io::CodedOutputStream::WriteRaw
                (&local_68,*(void **)((long)&(pFVar1->name)._M_dataplus._M_p + lVar5),
                 *(int *)((long)&(pFVar1->name)._M_string_length + lVar5));
      lVar5 = lVar5 + 0x30;
    } while (local_40 != lVar5);
  }
  io::CodedOutputStream::WriteLittleEndian32(&local_68,0x6054b50);
  uVar4 = local_70;
  local_76 = 0;
  io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
  local_76 = 0;
  io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
  local_76 = (short)uVar4;
  io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
  local_76 = (short)uVar4;
  io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
  io::CodedOutputStream::WriteLittleEndian32
            (&local_68,local_68.total_bytes_ - local_68.buffer_size_);
  io::CodedOutputStream::WriteLittleEndian32(&local_68,(uint32)local_48);
  local_76 = 0;
  io::CodedOutputStream::WriteRaw(&local_68,&local_76,2);
  io::CodedOutputStream::~CodedOutputStream(&local_68);
  return local_68.had_error_;
}

Assistant:

bool ZipWriter::WriteDirectory() {
  uint16 num_entries = files_.size();
  uint32 dir_ofs = raw_output_->ByteCount();

  // write central directory
  io::CodedOutputStream output(raw_output_);
  for (int i = 0; i < num_entries; ++i) {
    const string &filename = files_[i].name;
    uint16 filename_size = filename.size();
    uint32 crc32 = files_[i].crc32;
    uint32 size = files_[i].size;
    uint32 offset = files_[i].offset;

    output.WriteLittleEndian32(0x02014b50);  // magic
    WriteShort(&output, 10);  // version made by
    WriteShort(&output, 10);  // version needed to extract
    WriteShort(&output, 0);  // flags
    WriteShort(&output, 0);  // compression method: stored
    WriteShort(&output, 0);  // last modified time
    WriteShort(&output, 0);  // last modified date
    output.WriteLittleEndian32(crc32);  // crc-32
    output.WriteLittleEndian32(size);  // compressed size
    output.WriteLittleEndian32(size);  // uncompressed size
    WriteShort(&output, filename_size);  // file name length
    WriteShort(&output, 0);   // extra field length
    WriteShort(&output, 0);   // file comment length
    WriteShort(&output, 0);   // starting disk number
    WriteShort(&output, 0);   // internal file attributes
    output.WriteLittleEndian32(0);  // external file attributes
    output.WriteLittleEndian32(offset);  // local header offset
    output.WriteString(filename);  // file name
  }
  uint32 dir_len = output.ByteCount();

  // write end of central directory marker
  output.WriteLittleEndian32(0x06054b50);  // magic
  WriteShort(&output, 0);  // disk number
  WriteShort(&output, 0);  // disk with start of central directory
  WriteShort(&output, num_entries);  // central directory entries (this disk)
  WriteShort(&output, num_entries);  // central directory entries (total)
  output.WriteLittleEndian32(dir_len);  // central directory byte size
  output.WriteLittleEndian32(dir_ofs);  // central directory offset
  WriteShort(&output, 0);   // comment length

  return output.HadError();
}